

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt-ast.c
# Opt level: O3

ztast_intarray_t * ztast_intarray(ztast_t *ast,ztast_intarrayinner_t *inner)

{
  ztast_intarray_t *pzVar1;
  
  pzVar1 = (ztast_intarray_t *)(*ast->mallocfn)(8,ast->opaque);
  if (pzVar1 != (ztast_intarray_t *)0x0) {
    pzVar1->inner = inner;
  }
  return pzVar1;
}

Assistant:

ztast_intarray_t *ztast_intarray(ztast_t *ast, ztast_intarrayinner_t *inner)
{
  ztast_intarray_t *intarr;

  assert(ast);
  /* inner may be NULL */

#ifdef ZTAST_LOG
  if (ast->logfn)
    ast->logfn("ztast_intarray\n");
#endif

  intarr = ZTAST_MALLOC(sizeof(*intarr));
  if (intarr == NULL)
    return NULL;

  intarr->inner = inner;

  return intarr;
}